

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void lambert_textured_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double dVar1;
  vec3f v;
  array<vec<3UL,_int>,_3UL> pts;
  array<vec<2UL,_double>,_3UL> uvs;
  size_t sVar2;
  long lVar3;
  int j;
  long lVar4;
  size_t w;
  double *pdVar5;
  size_t y;
  size_t i;
  ulong iface;
  vec3i vVar6;
  vec2f vVar7;
  array<vec<3UL,_int>,_3UL> screen_coords;
  TGAImage depth;
  vec<3UL,_double> local_118;
  vec3f local_f8;
  vector<double,_std::allocator<double>_> zbuffer;
  array<vec<2UL,_double>,_3UL> uv_coords;
  string local_98;
  vec<3UL,_double> local_78;
  vec<3UL,_double> local_60;
  vec3f local_48;
  
  depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffefffffffffffff;
  std::vector<double,_std::allocator<double>_>::vector
            (&zbuffer,360000,(value_type_conflict *)&depth,(allocator_type *)&screen_coords);
  iface = 0;
  while( true ) {
    sVar2 = Model::nfaces(model);
    if (sVar2 <= iface) break;
    screen_coords._M_elems[1].y = 0;
    screen_coords._M_elems[1].z = 0;
    screen_coords._M_elems[2].x = 0;
    screen_coords._M_elems[2].y = 0;
    screen_coords._M_elems[0].x = 0;
    screen_coords._M_elems[0].y = 0;
    screen_coords._M_elems[0].z = 0;
    screen_coords._M_elems[1].x = 0;
    screen_coords._M_elems[2].z = 0;
    local_118.x = 0.0;
    local_118.y = 0.0;
    depth.bytespp = 0;
    depth._36_4_ = 0;
    local_118.z = 0.0;
    depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depth.width = 0;
    depth.height = 0;
    depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uv_coords._M_elems[0].x = 0.0;
    uv_coords._M_elems[0].y = 0.0;
    uv_coords._M_elems[1].x = 0.0;
    uv_coords._M_elems[1].y = 0.0;
    uv_coords._M_elems[2].x = 0.0;
    uv_coords._M_elems[2].y = 0.0;
    pdVar5 = &uv_coords._M_elems[0].y;
    lVar3 = 0;
    for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
      Model::vert(&local_48,model,iface,sVar2);
      v.y = local_48.y;
      v.x = local_48.x;
      v.z = local_48.z;
      vVar6 = world2screen(v);
      *(long *)((long)&screen_coords._M_elems[0].x + lVar3) = vVar6._0_8_;
      *(int *)((long)&screen_coords._M_elems[0].z + lVar3) = vVar6.z;
      Model::vert(&local_f8,model,iface,sVar2);
      *(double *)
       ((long)&depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar3 * 2) = local_f8.z;
      dVar1 = local_f8.y;
      *(double *)
       ((long)&depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar3 * 2) = local_f8.x;
      *(double *)
       ((long)&depth.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + lVar3 * 2) = dVar1;
      vVar7 = Model::uv(model,iface,sVar2);
      ((vec<2UL,_double> *)(pdVar5 + -1))->x = vVar7.x;
      *pdVar5 = vVar7.y;
      lVar3 = lVar3 + 0xc;
      pdVar5 = pdVar5 + 2;
    }
    operator-(&local_60,&local_118,(vec<3UL,_double> *)&depth);
    operator-(&local_78,(vec<3UL,_double> *)&depth.width,(vec<3UL,_double> *)&depth);
    local_f8.x = local_78.z * local_60.y - local_60.z * local_78.y;
    local_f8.y = local_78.x * local_60.z - local_60.x * local_78.z;
    local_f8.z = local_60.x * local_78.y - local_78.x * local_60.y;
    vec<3UL,_double>::normalize(&local_f8);
    dVar1 = dot<3ul,double>(&local_f8,&light_dir);
    if (0.0 < dVar1) {
      pts._M_elems[0].z = screen_coords._M_elems[0].z;
      pts._M_elems[1].x = screen_coords._M_elems[1].x;
      pts._M_elems[0].x = screen_coords._M_elems[0].x;
      pts._M_elems[0].y = screen_coords._M_elems[0].y;
      pts._M_elems[1].y = screen_coords._M_elems[1].y;
      pts._M_elems[1].z = screen_coords._M_elems[1].z;
      pts._M_elems[2].x = screen_coords._M_elems[2].x;
      pts._M_elems[2].y = screen_coords._M_elems[2].y;
      pts._M_elems[2].z = screen_coords._M_elems[2].z;
      uvs._M_elems[0].y = uv_coords._M_elems[0].y;
      uvs._M_elems[0].x = uv_coords._M_elems[0].x;
      uvs._M_elems[1].x = uv_coords._M_elems[1].x;
      uvs._M_elems[1].y = uv_coords._M_elems[1].y;
      uvs._M_elems[2].x = uv_coords._M_elems[2].x;
      uvs._M_elems[2].y = uv_coords._M_elems[2].y;
      triangle_textured(pts,uvs,&zbuffer,image,model);
    }
    iface = iface + 1;
  }
  TGAImage::TGAImage(&depth,600,600,1);
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != 600; sVar2 = sVar2 + 1) {
    lVar4 = lVar3;
    for (y = 0; y != 600; y = y + 1) {
      screen_coords._M_elems[0]._1_4_ = 0x1000000;
      screen_coords._M_elems[0].x._0_1_ =
           (char)(int)((*(double *)
                         ((long)zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar4) + 1.0) * 128.0);
      TGAImage::set(&depth,sVar2,y,(TGAColor *)&screen_coords);
      lVar4 = lVar4 + 0x12c0;
    }
    lVar3 = lVar3 + 8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"depth.tga",(allocator<char> *)&screen_coords);
  TGAImage::write_tga_file(&depth,&local_98,true,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&depth);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zbuffer.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void lambert_textured_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        std::array<vec2f, 3> uv_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
            uv_coords[j] = model.uv(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);

        if (intensity > 0) {
            triangle_textured(screen_coords, uv_coords, zbuffer, image, model);
        }
    }
    TGAImage depth(width, height, TGAImage::GRAYSCALE);
    for (size_t h = 0; h < height; h++)
        for (size_t w = 0; w < width; w++)
            depth.set(h, w, static_cast<uint8_t>((zbuffer[w * height + h] + 1) * 128));

    depth.write_tga_file("depth.tga");
}